

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O0

bool __thiscall
iDynTree::InverseKinematics::setFloatingBaseOnFrameNamed
          (InverseKinematics *this,string *floatingBaseFrameName)

{
  bool bVar1;
  
  bVar1 = missingIpoptErrorReport();
  return bVar1;
}

Assistant:

bool InverseKinematics::setFloatingBaseOnFrameNamed(const std::string &floatingBaseFrameName)
    {
#ifdef IDYNTREE_USES_IPOPT
        assert(m_pimpl);
        return IK_PIMPL(m_pimpl)->dynamics().setFloatingBase(floatingBaseFrameName);
#else
        return missingIpoptErrorReport();
#endif
    }